

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine.cpp
# Opt level: O0

void qGeomCalc(QList<QLayoutStruct> *chain,int start,int count,int pos,int space,int spacer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  reference pQVar5;
  int *piVar6;
  Fixed64 FVar7;
  Fixed64 FVar8;
  long lVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  bool bVar10;
  QLayoutStruct *data_8;
  int p;
  int extra;
  QLayoutStruct *data_7;
  QLayoutStruct *data_6;
  int w_1;
  QLayoutStruct *data_5;
  Fixed64 fp_w_1;
  Fixed64 fp_space;
  int deficit_1;
  int surplus;
  QLayoutStruct *data_4;
  int space_left_2;
  int n_1;
  int w;
  QLayoutStruct *data_3;
  Fixed64 fp_w;
  Fixed64 fp_over;
  bool finished;
  QLayoutStruct *data_2;
  int overdraft;
  int space_left_1;
  int n;
  QLayoutStruct *data_1;
  int rest;
  int maxval;
  int remainder;
  int deficitPerItem;
  int items;
  int deficit;
  int current;
  int space_used;
  int idx;
  int sum;
  int space_left;
  int minSize;
  int extraspace;
  QLayoutStruct *data;
  int i;
  int spacerCount;
  int pendingSpacing;
  bool allEmptyNonstretch;
  int expandingCount;
  int sumSpacing;
  int sumStretch;
  int cMin;
  int cHint;
  int maxv;
  QVarLengthArray<int,_32LL> minimumSizes;
  int *in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe10;
  uint uVar11;
  int in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int local_1d0;
  int local_1c0;
  long local_198;
  int local_188;
  int local_184;
  int local_174;
  int local_170;
  long local_160;
  int local_13c;
  int local_134;
  int local_124;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_f4;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_a4;
  QVarLengthArray<int,_32LL> local_a0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = 0;
  local_cc = 0;
  local_d0 = 0;
  local_d4 = 0;
  local_d8 = 0;
  bVar10 = true;
  local_e0 = -1;
  local_e4 = 0;
  for (local_e8 = in_ESI; local_e8 < in_ESI + in_EDX; local_e8 = local_e8 + 1) {
    pQVar5 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                        (qsizetype)in_stack_fffffffffffffe08);
    pQVar5->done = false;
    iVar2 = QLayoutStruct::smartSizeHint(pQVar5);
    local_c8 = iVar2 + local_c8;
    local_cc = pQVar5->minimumSize + local_cc;
    local_d0 = pQVar5->stretch + local_d0;
    if ((pQVar5->empty & 1U) == 0) {
      if (-1 < local_e0) {
        local_d4 = local_e0 + local_d4;
        local_e4 = local_e4 + 1;
      }
      local_e0 = QLayoutStruct::effectiveSpacer(pQVar5,in_R9D);
    }
    if ((pQVar5->expansive & 1U) != 0) {
      local_d8 = local_d8 + 1;
    }
    bVar1 = false;
    if (((bVar10) && (bVar1 = false, (pQVar5->empty & 1U) != 0)) &&
       (bVar1 = false, (pQVar5->expansive & 1U) == 0)) {
      bVar1 = pQVar5->stretch < 1;
    }
    bVar10 = bVar1;
  }
  local_f4 = 0;
  local_c4 = in_R9D;
  if (in_R8D < local_cc + local_d4) {
    if (-1 < in_R9D) {
      if (local_cc + local_d4 < 1) {
        local_1d0 = 0;
      }
      else {
        local_1d0 = (in_R9D * in_R8D) / (local_cc + local_d4);
      }
      local_c4 = local_1d0;
      local_d4 = local_1d0 * local_e4;
    }
    memset(&local_a0,0xaa,0x98);
    QVarLengthArray<int,_32LL>::QVarLengthArray(&local_a0);
    QVarLengthArray<int,_32LL>::reserve
              ((QVarLengthArray<int,_32LL> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    for (local_e8 = in_ESI; local_e8 < in_ESI + in_EDX; local_e8 = local_e8 + 1) {
      QList<QLayoutStruct>::at
                ((QList<QLayoutStruct> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (qsizetype)in_stack_fffffffffffffe08);
      QVarLengthArray<int,_32LL>::operator<<
                ((QVarLengthArray<int,_32LL> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08);
    }
    QVLABase<int>::begin((QVLABase<int> *)0x341fde);
    QVLABase<int>::end((QVLABase<int> *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    std::sort<int*>((int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                    (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_100 = 0;
    local_108 = 0;
    local_10c = 0;
    for (local_104 = 0; local_104 < in_EDX && local_108 < in_R8D - local_d4;
        local_104 = local_104 + 1) {
      piVar6 = QVarLengthArray<int,_32LL>::at
                         ((QVarLengthArray<int,_32LL> *)
                          CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                          (qsizetype)in_stack_fffffffffffffe08);
      local_10c = *piVar6;
      local_108 = local_100 + local_10c * (in_EDX - local_104);
      local_100 = local_10c + local_100;
    }
    local_108 = local_108 - (in_R8D - local_d4);
    iVar2 = in_EDX - (local_104 + -1);
    local_10c = local_10c - local_108 / iVar2;
    local_124 = 0;
    for (local_e8 = in_ESI; local_e8 < in_ESI + in_EDX; local_e8 = local_e8 + 1) {
      local_124 = local_108 % iVar2 + local_124;
      local_a4 = local_10c;
      if (iVar2 <= local_124) {
        local_a4 = local_10c + -1;
        local_124 = local_124 - iVar2;
      }
      pQVar5 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                          (qsizetype)in_stack_fffffffffffffe08);
      piVar6 = qMin<int>(&pQVar5->minimumSize,&local_a4);
      pQVar5->size = *piVar6;
      pQVar5->done = true;
    }
    QVarLengthArray<int,_32LL>::~QVarLengthArray
              ((QVarLengthArray<int,_32LL> *)
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  }
  else if (in_R8D < local_c8 + local_d4) {
    local_13c = local_c8 - (in_R8D - local_d4);
    local_134 = in_EDX;
    for (local_e8 = in_ESI; local_e8 < in_ESI + in_EDX; local_e8 = local_e8 + 1) {
      pQVar5 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                          (qsizetype)in_stack_fffffffffffffe08);
      if ((pQVar5->done & 1U) == 0) {
        iVar2 = pQVar5->minimumSize;
        iVar3 = QLayoutStruct::smartSizeHint(pQVar5);
        if (iVar3 <= iVar2) {
          iVar2 = QLayoutStruct::smartSizeHint(pQVar5);
          pQVar5->size = iVar2;
          pQVar5->done = true;
          QLayoutStruct::smartSizeHint(pQVar5);
          local_134 = local_134 + -1;
        }
      }
    }
    bVar10 = local_134 == 0;
LAB_003423bb:
    if (!bVar10) {
      bVar10 = true;
      FVar7 = toFixed(local_13c);
      local_160 = 0;
      for (local_e8 = in_ESI; local_e8 < in_ESI + in_EDX; local_e8 = local_e8 + 1) {
        pQVar5 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            (qsizetype)in_stack_fffffffffffffe08);
        if ((pQVar5->done & 1U) == 0) {
          local_160 = FVar7 / (long)local_134 + local_160;
          iVar2 = fRound(local_160);
          iVar3 = QLayoutStruct::smartSizeHint(pQVar5);
          pQVar5->size = iVar3 - iVar2;
          FVar8 = toFixed(iVar2);
          local_160 = local_160 - FVar8;
          if (pQVar5->size < pQVar5->minimumSize) {
            pQVar5->done = true;
            pQVar5->size = pQVar5->minimumSize;
            bVar10 = false;
            iVar2 = QLayoutStruct::smartSizeHint(pQVar5);
            local_13c = local_13c - (iVar2 - pQVar5->minimumSize);
            local_134 = local_134 + -1;
            break;
          }
        }
      }
      goto LAB_003423bb;
    }
  }
  else {
    local_174 = in_R8D - local_d4;
    local_170 = in_EDX;
    for (local_e8 = in_ESI; local_e8 < in_ESI + in_EDX; local_e8 = local_e8 + 1) {
      pQVar5 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                          (qsizetype)in_stack_fffffffffffffe08);
      if ((pQVar5->done & 1U) == 0) {
        iVar2 = pQVar5->maximumSize;
        iVar3 = QLayoutStruct::smartSizeHint(pQVar5);
        if ((iVar2 <= iVar3) ||
           (((!bVar10 && ((pQVar5->empty & 1U) != 0)) &&
            (((pQVar5->expansive & 1U) == 0 && (pQVar5->stretch == 0)))))) {
          iVar2 = QLayoutStruct::smartSizeHint(pQVar5);
          pQVar5->size = iVar2;
          pQVar5->done = true;
          local_174 = local_174 - pQVar5->size;
          local_d0 = local_d0 - pQVar5->stretch;
          if ((pQVar5->expansive & 1U) != 0) {
            local_d8 = local_d8 + -1;
          }
          local_170 = local_170 + -1;
        }
      }
    }
    local_f4 = local_174;
    do {
      local_188 = 0;
      local_184 = 0;
      FVar7 = toFixed(local_174);
      local_198 = 0;
      uVar11 = in_stack_fffffffffffffe10;
      for (local_e8 = in_ESI; local_e8 < in_ESI + in_EDX; local_e8 = local_e8 + 1) {
        pQVar5 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)CONCAT44(in_stack_fffffffffffffe14,uVar11),
                            (qsizetype)in_stack_fffffffffffffe08);
        if ((pQVar5->done & 1U) == 0) {
          local_f4 = 0;
          if (local_d0 < 1) {
            if (local_d8 < 1) {
              lVar9 = FVar7 / (long)local_170;
            }
            else {
              lVar9 = (FVar7 * (int)(uint)((pQVar5->expansive & 1U) != 0)) / (long)local_d8;
            }
          }
          else {
            lVar9 = (FVar7 * pQVar5->stretch) / (long)local_d0;
          }
          local_198 = lVar9 + local_198;
          iVar3 = fRound(local_198);
          pQVar5->size = iVar3;
          FVar8 = toFixed(iVar3);
          local_198 = local_198 - FVar8;
          iVar2 = iVar3;
          iVar4 = QLayoutStruct::smartSizeHint(pQVar5);
          if (iVar2 < iVar4) {
            iVar2 = QLayoutStruct::smartSizeHint(pQVar5);
            local_188 = (iVar2 - iVar3) + local_188;
          }
          else if (pQVar5->maximumSize < iVar3) {
            local_184 = (iVar3 - pQVar5->maximumSize) + local_184;
          }
        }
      }
      if ((0 < local_188) && (local_e8 = in_ESI, local_184 <= local_188)) {
        for (; local_e8 < in_ESI + in_EDX; local_e8 = local_e8 + 1) {
          pQVar5 = QList<QLayoutStruct>::operator[]
                             ((QList<QLayoutStruct> *)CONCAT44(in_stack_fffffffffffffe14,uVar11),
                              (qsizetype)in_stack_fffffffffffffe08);
          if ((pQVar5->done & 1U) == 0) {
            in_stack_fffffffffffffe14 = pQVar5->size;
            iVar2 = QLayoutStruct::smartSizeHint(pQVar5);
            if (in_stack_fffffffffffffe14 < iVar2) {
              iVar2 = QLayoutStruct::smartSizeHint(pQVar5);
              pQVar5->size = iVar2;
              pQVar5->done = true;
              iVar2 = QLayoutStruct::smartSizeHint(pQVar5);
              local_174 = local_174 - iVar2;
              local_d0 = local_d0 - pQVar5->stretch;
              if ((pQVar5->expansive & 1U) != 0) {
                local_d8 = local_d8 + -1;
              }
              local_170 = local_170 + -1;
            }
          }
        }
      }
      if ((0 < local_184) && (local_e8 = in_ESI, local_188 <= local_184)) {
        for (; local_e8 < in_ESI + in_EDX; local_e8 = local_e8 + 1) {
          pQVar5 = QList<QLayoutStruct>::operator[]
                             ((QList<QLayoutStruct> *)CONCAT44(in_stack_fffffffffffffe14,uVar11),
                              (qsizetype)in_stack_fffffffffffffe08);
          if (((pQVar5->done & 1U) == 0) && (pQVar5->maximumSize < pQVar5->size)) {
            pQVar5->size = pQVar5->maximumSize;
            pQVar5->done = true;
            local_174 = local_174 - pQVar5->maximumSize;
            local_d0 = local_d0 - pQVar5->stretch;
            if ((pQVar5->expansive & 1U) != 0) {
              local_d8 = local_d8 + -1;
            }
            local_170 = local_170 + -1;
          }
        }
      }
      in_stack_fffffffffffffe10 = uVar11 & 0xffffff;
      if (0 < local_170) {
        in_stack_fffffffffffffe10 = CONCAT13(local_184 != local_188,(int3)uVar11);
      }
    } while ((char)(in_stack_fffffffffffffe10 >> 0x18) != '\0');
    if (local_170 == 0) {
      local_f4 = local_174;
    }
  }
  local_f4 = local_f4 / (local_e4 + 2);
  local_1c0 = in_ECX + local_f4;
  for (local_e8 = in_ESI; local_e8 < in_ESI + in_EDX; local_e8 = local_e8 + 1) {
    pQVar5 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                        (qsizetype)in_stack_fffffffffffffe08);
    pQVar5->pos = local_1c0;
    local_1c0 = pQVar5->size + local_1c0;
    if ((pQVar5->empty & 1U) == 0) {
      iVar2 = QLayoutStruct::effectiveSpacer(pQVar5,local_c4);
      local_1c0 = iVar2 + local_f4 + local_1c0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qGeomCalc(QList<QLayoutStruct> &chain, int start, int count, int pos, int space, int spacer)
{
    int cHint = 0;
    int cMin = 0;
    int sumStretch = 0;
    int sumSpacing = 0;
    int expandingCount = 0;

    bool allEmptyNonstretch = true;
    int pendingSpacing = -1;
    int spacerCount = 0;
    int i;

    for (i = start; i < start + count; i++) {
        QLayoutStruct *data = &chain[i];

        data->done = false;
        cHint += data->smartSizeHint();
        cMin += data->minimumSize;
        sumStretch += data->stretch;
        if (!data->empty) {
            /*
                Using pendingSpacing, we ensure that the spacing for the last
                (non-empty) item is ignored.
            */
            if (pendingSpacing >= 0) {
                sumSpacing += pendingSpacing;
                ++spacerCount;
            }
            pendingSpacing = data->effectiveSpacer(spacer);
        }
        if (data->expansive)
            expandingCount++;
        allEmptyNonstretch = allEmptyNonstretch && data->empty && !data->expansive && data->stretch <= 0;
    }

    int extraspace = 0;

    if (space < cMin + sumSpacing) {
        /*
          Less space than minimumSize; take from the biggest first
        */

        int minSize = cMin + sumSpacing;

        // shrink the spacers proportionally
        if (spacer >= 0) {
            spacer = minSize > 0 ? spacer * space / minSize : 0;
            sumSpacing = spacer * spacerCount;
        }

        QVarLengthArray<int, 32> minimumSizes;
        minimumSizes.reserve(count);

        for (i = start; i < start + count; i++)
            minimumSizes << chain.at(i).minimumSize;

        std::sort(minimumSizes.begin(), minimumSizes.end());

        int space_left = space - sumSpacing;

        int sum = 0;
        int idx = 0;
        int space_used=0;
        int current = 0;
        while (idx < count && space_used < space_left) {
            current = minimumSizes.at(idx);
            space_used = sum + current * (count - idx);
            sum += current;
            ++idx;
        }
        --idx;
        int deficit = space_used - space_left;

        int items = count - idx;
        /*
         * If we truncate all items to "current", we would get "deficit" too many pixels. Therefore, we have to remove
         * deficit/items from each item bigger than maxval. The actual value to remove is deficitPerItem + remainder/items
         * "rest" is the accumulated error from using integer arithmetic.
        */
        int deficitPerItem = deficit/items;
        int remainder = deficit % items;
        int maxval = current - deficitPerItem;

        int rest = 0;
        for (i = start; i < start + count; i++) {
            int maxv = maxval;
            rest += remainder;
            if (rest >= items) {
                maxv--;
                rest-=items;
            }
            QLayoutStruct *data = &chain[i];
            data->size = qMin(data->minimumSize, maxv);
            data->done = true;
        }
    } else if (space < cHint + sumSpacing) {
        /*
          Less space than smartSizeHint(), but more than minimumSize.
          Currently take space equally from each, as in Qt 2.x.
          Commented-out lines will give more space to stretchier
          items.
        */
        int n = count;
        int space_left = space - sumSpacing;
        int overdraft = cHint - space_left;

        // first give to the fixed ones:
        for (i = start; i < start + count; i++) {
            QLayoutStruct *data = &chain[i];
            if (!data->done
                 && data->minimumSize >= data->smartSizeHint()) {
                data->size = data->smartSizeHint();
                data->done = true;
                space_left -= data->smartSizeHint();
                // sumStretch -= data->stretch;
                n--;
            }
        }
        bool finished = n == 0;
        while (!finished) {
            finished = true;
            Fixed64 fp_over = toFixed(overdraft);
            Fixed64 fp_w = 0;

            for (i = start; i < start+count; i++) {
                QLayoutStruct *data = &chain[i];
                if (data->done)
                    continue;
                // if (sumStretch <= 0)
                fp_w += fp_over / n;
                // else
                //    fp_w += (fp_over * data->stretch) / sumStretch;
                int w = fRound(fp_w);
                data->size = data->smartSizeHint() - w;
                fp_w -= toFixed(w); // give the difference to the next
                if (data->size < data->minimumSize) {
                    data->done = true;
                    data->size = data->minimumSize;
                    finished = false;
                    overdraft -= data->smartSizeHint() - data->minimumSize;
                    // sumStretch -= data->stretch;
                    n--;
                    break;
                }
            }
        }
    } else { // extra space
        int n = count;
        int space_left = space - sumSpacing;
        // first give to the fixed ones, and handle non-expansiveness
        for (i = start; i < start + count; i++) {
            QLayoutStruct *data = &chain[i];
            if (!data->done
                && (data->maximumSize <= data->smartSizeHint()
                    || (!allEmptyNonstretch && data->empty &&
                        !data->expansive && data->stretch == 0))) {
                data->size = data->smartSizeHint();
                data->done = true;
                space_left -= data->size;
                sumStretch -= data->stretch;
                 if (data->expansive)
                     expandingCount--;
                n--;
            }
        }
        extraspace = space_left;

        /*
          Do a trial distribution and calculate how much it is off.
          If there are more deficit pixels than surplus pixels, give
          the minimum size items what they need, and repeat.
          Otherwise give to the maximum size items, and repeat.

          Paul Olav Tvete has a wonderful mathematical proof of the
          correctness of this principle, but unfortunately this
          comment is too small to contain it.
        */
        int surplus, deficit;
        do {
            surplus = deficit = 0;
            Fixed64 fp_space = toFixed(space_left);
            Fixed64 fp_w = 0;
            for (i = start; i < start + count; i++) {
                QLayoutStruct *data = &chain[i];
                if (data->done)
                    continue;
                extraspace = 0;
                if (sumStretch > 0) {
                    fp_w += (fp_space * data->stretch) / sumStretch;
                } else if (expandingCount > 0) {
                    fp_w += (fp_space * (data->expansive ? 1 : 0)) / expandingCount;
                } else {
                    fp_w += fp_space * 1 / n;
                }
                int w = fRound(fp_w);
                data->size = w;
                fp_w -= toFixed(w); // give the difference to the next
                if (w < data->smartSizeHint()) {
                    deficit +=  data->smartSizeHint() - w;
                } else if (w > data->maximumSize) {
                    surplus += w - data->maximumSize;
                }
            }
            if (deficit > 0 && surplus <= deficit) {
                // give to the ones that have too little
                for (i = start; i < start+count; i++) {
                    QLayoutStruct *data = &chain[i];
                    if (!data->done && data->size < data->smartSizeHint()) {
                        data->size = data->smartSizeHint();
                        data->done = true;
                        space_left -= data->smartSizeHint();
                        sumStretch -= data->stretch;
                        if (data->expansive)
                            expandingCount--;
                        n--;
                    }
                }
            }
            if (surplus > 0 && surplus >= deficit) {
                // take from the ones that have too much
                for (i = start; i < start + count; i++) {
                    QLayoutStruct *data = &chain[i];
                    if (!data->done && data->size > data->maximumSize) {
                        data->size = data->maximumSize;
                        data->done = true;
                        space_left -= data->maximumSize;
                        sumStretch -= data->stretch;
                        if (data->expansive)
                            expandingCount--;
                        n--;
                    }
                }
            }
        } while (n > 0 && surplus != deficit);
        if (n == 0)
            extraspace = space_left;
    }

    /*
      As a last resort, we distribute the unwanted space equally
      among the spacers (counting the start and end of the chain). We
      could, but don't, attempt a sub-pixel allocation of the extra
      space.
    */
    int extra = extraspace / (spacerCount + 2);
    int p = pos + extra;
    for (i = start; i < start+count; i++) {
        QLayoutStruct *data = &chain[i];
        data->pos = p;
        p += data->size;
        if (!data->empty)
            p += data->effectiveSpacer(spacer) + extra;
    }

#ifdef QLAYOUT_EXTRA_DEBUG
    qDebug() << "qGeomCalc" << "start" << start <<  "count" << count <<  "pos" << pos
             <<  "space" << space <<  "spacer" << spacer;
    for (i = start; i < start + count; ++i) {
        qDebug() << i << ':' << chain[i].minimumSize << chain[i].smartSizeHint()
                 << chain[i].maximumSize << "stretch" << chain[i].stretch
                 << "empty" << chain[i].empty << "expansive" << chain[i].expansive
                 << "spacing" << chain[i].spacing;
        qDebug() << "result pos" << chain[i].pos << "size" << chain[i].size;
    }
#endif
}